

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int mainprog(nccfgstate *state)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_RDI;
  int ec;
  char **unaff_retaddr;
  char **argEnd;
  char **argBegin;
  char **arg0;
  mcu8str cmdname;
  int max_nargs;
  int min_nargs;
  char mode;
  int argc;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  mcu8str *in_stack_ffffffffffffffb0;
  nccfgstate *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  nccfgstate *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  iVar5 = *(int *)(in_RDI + 0x30);
  if (iVar5 < 2) {
    cVar1 = '\0';
  }
  else {
    cVar1 = mcplcfg_decode_modeflag
                      ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  iVar2 = 2;
  if (cVar1 == 's') {
    iVar2 = 3;
  }
  iVar3 = 2;
  if (cVar1 == 's') {
    iVar3 = 99;
  }
  if (((cVar1 == '\0') || (iVar3 < iVar5)) || (iVar5 < iVar2)) {
    mcplcfg_thiscmdname(in_stack_ffffffffffffffd0);
    fprintf(_stderr,
            "%s: error: Missing or invalid arguments. Run with --help for usage instructions.\n",
            local_38);
    mcu8str_dealloc(in_stack_ffffffffffffffb0);
    iVar5 = 1;
  }
  else if (cVar1 == 's') {
    iVar5 = mcplcfg_mode_show((nccfgstate *)argEnd,unaff_retaddr,
                              (char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             );
  }
  else {
    if (cVar1 == 'i') {
      pcVar4 = mcplcfg_const_intversion();
      printf("%s\n",pcVar4);
    }
    else if (cVar1 == 'v') {
      pcVar4 = mcplcfg_const_version();
      printf("%s\n",pcVar4);
    }
    else if (cVar1 == 'h') {
      mcplcfg_show_help(in_stack_ffffffffffffffc0);
    }
    else {
      mcplcfg_show_summary((nccfgstate *)CONCAT44(iVar2,iVar3));
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int mainprog( nccfgstate* state )
{
  int argc = state->argc;
  char mode = ( argc >= 2
                ? mcplcfg_decode_modeflag(state->argv[1])
                : MCPLCFG_MODE_INVALID );

  int min_nargs = mode == MCPLCFG_MODE_SHOW ? 3 : 2;
  int max_nargs = mode == MCPLCFG_MODE_SHOW ? 99 : 2;
  if ( mode == MCPLCFG_MODE_INVALID || argc > max_nargs || argc < min_nargs ) {
    mcu8str cmdname = mcplcfg_thiscmdname(state);
    fprintf(stderr,"%s: error: Missing or invalid arguments."
            " Run with --help for usage instructions.\n",cmdname.c_str);
    mcu8str_dealloc(&cmdname);
    return 1;
  }

  if ( mode == MCPLCFG_MODE_SHOW ) {
    const char ** arg0 = (const char**)&(state->argv[0]);
    const char ** argBegin = arg0 + 2;
    const char ** argEnd = arg0 + argc;
    int ec = mcplcfg_mode_show( state, argBegin, argEnd );
    return ec;
  }

  if ( mode == MCPLCFG_MODE_INTVERSION ) {
    printf("%s\n",mcplcfg_const_intversion());
  } else if ( mode == MCPLCFG_MODE_VERSION ) {
    printf("%s\n",mcplcfg_const_version());
  } else if ( mode == MCPLCFG_MODE_HELP ) {
    mcplcfg_show_help(state);
  } else {
    assert( mode == MCPLCFG_MODE_SUMMARY );
    mcplcfg_show_summary(state);
  }

  return 0;
}